

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_deepseek::llm_build_deepseek
          (llm_build_deepseek *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  float fVar1;
  uint uVar2;
  llama_hparams *plVar3;
  llama_memory_i *plVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  pointer plVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  int il;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar15;
  ggml_tensor *local_88;
  int local_70;
  undefined4 local_6c;
  ggml_cgraph *local_68;
  ggml_tensor *local_60;
  undefined8 local_58;
  llm_graph_input_attn_kv_unified *local_50;
  undefined1 local_48 [16];
  
  local_68 = gf;
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar3 = (this->super_llm_graph_context).hparams;
  uVar2 = plVar3->n_embd_head_v;
  if (uVar2 == plVar3->n_embd_head_k) {
    if (uVar2 == plVar3->n_rot) {
      local_88 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      local_60 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      local_50 = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      if (0 < (this->super_llm_graph_context).n_layer) {
        fVar1 = ((this->super_llm_graph_context).hparams)->f_attention_scale;
        uVar14 = -(uint)(fVar1 == 0.0);
        local_48 = ZEXT416(~uVar14 & (uint)fVar1 | (uint)(1.0 / SQRT((float)uVar2)) & uVar14);
        lVar13 = 0;
        uVar12 = 0;
        do {
          uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
          il = (int)uVar12;
          pgVar5 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,local_88,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->attn_norm +
                               lVar13),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"attn_norm",il);
          plVar4 = (this->super_llm_graph_context).memory;
          local_6c = (undefined4)(this->super_llm_graph_context).n_ctx_per_seq;
          local_70 = il;
          if (plVar4[10]._vptr_llama_memory_i == (_func_int **)0x0) {
            std::__throw_bad_function_call();
          }
          local_58 = (*(code *)plVar4[0xb]._vptr_llama_memory_i)(plVar4 + 8,&local_6c,&local_70);
          pgVar6 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wq + lVar13),
                              pgVar5);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il);
          plVar8 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&plVar8->bq + lVar13) != 0) {
            pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il);
            plVar8 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          pgVar7 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)((long)&plVar8->wk + lVar13),pgVar5);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Kcur",il);
          plVar8 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&plVar8->bk + lVar13) != 0) {
            pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Kcur",il);
            plVar8 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          pgVar5 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)((long)&plVar8->wv + lVar13),pgVar5);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Vcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bv + lVar13) != 0) {
            pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Vcur",il);
          }
          uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar2,
                                  (this->super_llm_graph_context).n_head,
                                  (long)(this->super_llm_graph_context).n_tokens);
          uVar10 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar2,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar5 = (ggml_tensor *)
                   ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar5,uVar2,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar6 = (ggml_tensor *)
                   ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                 (this->super_llm_graph_context).ctx0,uVar9,local_60,local_58,
                                 (int)(this->super_llm_graph_context).n_rot,
                                 (this->super_llm_graph_context).rope_type,
                                 CONCAT44(uVar15,(this->super_llm_graph_context).n_ctx_orig));
          pgVar7 = (ggml_tensor *)
                   ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                 (this->super_llm_graph_context).ctx0,uVar10,local_60,local_58,
                                 (int)(this->super_llm_graph_context).n_rot,
                                 (this->super_llm_graph_context).rope_type,
                                 (this->super_llm_graph_context).n_ctx_orig);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Kcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Vcur",il);
          plVar8 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pgVar5 = llm_graph_context::build_attn
                             (&this->super_llm_graph_context,local_50,local_68,
                              *(ggml_tensor **)((long)&plVar8->wo + lVar13),
                              *(ggml_tensor **)((long)&plVar8->bo + lVar13),pgVar6,pgVar7,pgVar5,
                              (ggml_tensor *)0x0,(ggml_tensor *)0x0,(float)local_48._0_4_,il);
          if (uVar12 == (this->super_llm_graph_context).n_layer - 1U) {
            pgVar6 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
            pgVar5 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar5,pgVar6);
            local_88 = (ggml_tensor *)
                       ggml_get_rows((this->super_llm_graph_context).ctx0,local_88,pgVar6);
          }
          pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,local_88);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_inp",il);
          pgVar6 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,pgVar5,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ffn_norm +
                               lVar13),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_norm",il);
          plVar3 = (this->super_llm_graph_context).hparams;
          plVar8 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (uVar12 < plVar3->n_layer_dense_lead) {
            in_stack_ffffffffffffff28 = 0;
            pgVar6 = llm_graph_context::build_ffn
                               (&this->super_llm_graph_context,pgVar6,
                                *(ggml_tensor **)((long)&plVar8->ffn_up + lVar13),(ggml_tensor *)0x0
                                ,(ggml_tensor *)0x0,
                                *(ggml_tensor **)((long)&plVar8->ffn_gate + lVar13),
                                (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                *(ggml_tensor **)((long)&plVar8->ffn_down + lVar13),
                                (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                LLM_FFN_SILU,LLM_FFN_PAR,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_out",il);
          }
          else {
            pgVar7 = llm_graph_context::build_moe_ffn
                               (&this->super_llm_graph_context,pgVar6,
                                *(ggml_tensor **)((long)&plVar8->ffn_gate_inp + lVar13),
                                *(ggml_tensor **)((long)&plVar8->ffn_up_exps + lVar13),
                                *(ggml_tensor **)((long)&plVar8->ffn_gate_exps + lVar13),
                                *(ggml_tensor **)((long)&plVar8->ffn_down_exps + lVar13),
                                (ggml_tensor *)0x0,(this->super_llm_graph_context).n_expert,
                                (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,false,
                                false,plVar3->expert_weights_scale,
                                LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_moe_out",il);
            plVar8 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            in_stack_ffffffffffffff28 = 0;
            pgVar6 = llm_graph_context::build_ffn
                               (&this->super_llm_graph_context,pgVar6,
                                *(ggml_tensor **)((long)&plVar8->ffn_up_shexp + lVar13),
                                (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                *(ggml_tensor **)((long)&plVar8->ffn_gate_shexp + lVar13),
                                (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                *(ggml_tensor **)((long)&plVar8->ffn_down_shexp + lVar13),
                                (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                LLM_FFN_SILU,LLM_FFN_PAR,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_shexp",il);
            pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7,pgVar6);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_out",il);
          }
          pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,pgVar5);
          local_88 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar5,il);
          llm_graph_context::cb(&this->super_llm_graph_context,local_88,"l_out",il);
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x4f0;
        } while ((long)uVar12 < (this->super_llm_graph_context).n_layer);
      }
      pgVar5 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_88,model->output_norm,
                          (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar5;
      pgVar5 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar5)
      ;
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar5;
      ggml_build_forward_expand(local_68,pgVar5);
      return;
    }
    pcVar11 = "n_embd_head == hparams.n_rot";
    uVar9 = 0x2694;
  }
  else {
    pcVar11 = "n_embd_head == hparams.n_embd_head_k";
    uVar9 = 0x2693;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar9,"GGML_ASSERT(%s) failed",pcVar11);
}

Assistant:

llm_build_deepseek(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        const float kq_scale = hparams.f_attention_scale == 0.0f ? 1.0f/sqrtf(float(n_embd_head)) : hparams.f_attention_scale;

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // rope freq factors for llama3; may return nullptr for llama2 and other models
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, kq_scale, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }


            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            if ((uint32_t) il < hparams.n_layer_dense_lead) {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            } else {
                // MoE branch
                ggml_tensor * moe_out =
                    build_moe_ffn(cur,
                            model.layers[il].ffn_gate_inp,
                            model.layers[il].ffn_up_exps,
                            model.layers[il].ffn_gate_exps,
                            model.layers[il].ffn_down_exps,
                            nullptr,
                            n_expert, n_expert_used,
                            LLM_FFN_SILU, false,
                            false, hparams.expert_weights_scale,
                            LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                            il);
                cb(moe_out, "ffn_moe_out", il);

                // FFN shared expert
                {
                    ggml_tensor * ffn_shexp = build_ffn(cur,
                            model.layers[il].ffn_up_shexp,   NULL, NULL,
                            model.layers[il].ffn_gate_shexp, NULL, NULL,
                            model.layers[il].ffn_down_shexp, NULL, NULL,
                            NULL,
                            LLM_FFN_SILU, LLM_FFN_PAR, il);
                    cb(ffn_shexp, "ffn_shexp", il);

                    cur = ggml_add(ctx0, moe_out, ffn_shexp);
                    cb(cur, "ffn_out", il);
                }
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }